

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_term.cc
# Opt level: O1

void GA::Initialize(int argc,char **argv,size_t limit)

{
  int local_14;
  char **local_10;
  
  local_14 = argc;
  local_10 = argv;
  MPI_Init(&local_14,&local_10);
  if (limit == 0) {
    GA_Initialize();
  }
  else {
    GA_Initialize_ltd(limit);
  }
  return;
}

Assistant:

void
GA::Initialize(int argc, char *argv[], size_t limit) {
  MP_INIT(argc, argv);

  // GA Initialization
  if(limit == 0) 
    GA_Initialize();
  else 
    GA_Initialize_ltd(limit);
}